

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildSetupFont
               (ImFontAtlas *atlas,ImFont *font,ImFontConfig *font_config,float ascent,float descent
               )

{
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  
  if ((*(byte *)(in_RDX + 0x48) & 1) == 0) {
    ImFont::ClearOutputData((ImFont *)CONCAT44(in_XMM0_Da,in_XMM1_Da));
    *(undefined4 *)(in_RSI + 0x14) = *(undefined4 *)(in_RDX + 0x14);
    *(undefined8 *)(in_RSI + 0x40) = in_RDI;
    *(undefined4 *)(in_RSI + 0x68) = in_XMM0_Da;
    *(undefined4 *)(in_RSI + 0x6c) = in_XMM1_Da;
  }
  return;
}

Assistant:

void ImFontAtlasBuildSetupFont(ImFontAtlas* atlas, ImFont* font, ImFontConfig* font_config, float ascent, float descent)
{
    if (!font_config->MergeMode)
    {
        font->ClearOutputData();
        font->FontSize = font_config->SizePixels;
        IM_ASSERT(font->ConfigData == font_config);
        font->ContainerAtlas = atlas;
        font->Ascent = ascent;
        font->Descent = descent;
    }
}